

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O3

void __thiscall CS248::DynamicScene::Joint::Joint(Joint *this,Skeleton *s)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  key_type local_20;
  
  p_Var1 = &(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header;
  (this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  (this->super_SceneObject).scene = (Scene *)0x0;
  (this->super_SceneObject).position.x = 0.0;
  (this->super_SceneObject).position.y = 0.0;
  (this->super_SceneObject).position.z = 0.0;
  (this->super_SceneObject).rotation.x = 0.0;
  (this->super_SceneObject).rotation.y = 0.0;
  (this->super_SceneObject).rotation.z = 0.0;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header;
  (this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header;
  (this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header + 8)
       = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_SceneObject).isVisible = true;
  (this->super_SceneObject).isGhosted = false;
  (this->super_SceneObject).isPickable = true;
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_0026c948;
  (this->ikAngleGradient).z = 0.0;
  (this->ikAngleGradient).x = 0.0;
  (this->ikAngleGradient).y = 0.0;
  (this->axis).y = 0.0;
  (this->axis).z = 0.0;
  (this->kids).
  super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->axis).x = 0.0;
  (this->kids).
  super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->kids).
  super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->skeleton = s;
  this->capsuleRadius = 0.05;
  this->renderScale = 1.0;
  (this->super_SceneObject).scale.x = 1.0;
  (this->super_SceneObject).scale.y = 1.0;
  (this->super_SceneObject).scale.z = 1.0;
  local_20 = 0.0;
  pmVar2 = std::
           map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
           ::operator[](&(this->super_SceneObject).scales.knots,&local_20);
  pmVar2->x = 1.0;
  pmVar2->y = 1.0;
  pmVar2->z = 1.0;
  return;
}

Assistant:

Joint::Joint(Skeleton* s) : skeleton(s), capsuleRadius(0.05), renderScale(1.0) {
  scale = Vector3D(1., 1., 1.);
  scales.setValue(0, scale);
}